

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O2

void Eigen::internal::queryCacheSizes_amd(int *l1,int *l2,int *l3)

{
  long lVar1;
  int iVar2;
  
  lVar1 = cpuid(0x80000005);
  *l1 = *(int *)(lVar1 + 0xc) >> 0xe & 0xfffffc00;
  lVar1 = cpuid(0x80000006);
  iVar2 = *(int *)(lVar1 + 8);
  *l2 = *(int *)(lVar1 + 0xc) >> 6 & 0xfffffc00;
  *l3 = iVar2 * 2 & 0x1ff80000;
  return;
}

Assistant:

inline void queryCacheSizes_amd(int& l1, int& l2, int& l3)
{
  int abcd[4];
  abcd[0] = abcd[1] = abcd[2] = abcd[3] = 0;
  EIGEN_CPUID(abcd,0x80000005,0);
  l1 = (abcd[2] >> 24) * 1024; // C[31:24] = L1 size in KB
  abcd[0] = abcd[1] = abcd[2] = abcd[3] = 0;
  EIGEN_CPUID(abcd,0x80000006,0);
  l2 = (abcd[2] >> 16) * 1024; // C[31;16] = l2 cache size in KB
  l3 = ((abcd[3] & 0xFFFC000) >> 18) * 512 * 1024; // D[31;18] = l3 cache size in 512KB
}